

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

void proof_chain_start(sat_solver2 *s,clause *c)

{
  clause cVar1;
  Prf_Man_t *p;
  Vec_Wrd_t *pVVar2;
  int iVar3;
  uint uVar4;
  word *pwVar5;
  int *piVar6;
  int iVar7;
  
  if (s->fProofLogging != 0) {
    if (s->pInt2 != (Int2_Man_t *)0x0) {
      iVar3 = Int2_ManChainStart(s->pInt2,c);
      s->tempInter = iVar3;
    }
    p = s->pPrf2;
    if (p != (Prf_Man_t *)0x0) {
      if (p->iFirst < 0) {
        __assert_fail("p->iFirst >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                      ,0x103,"void Prf_ManChainStart(Prf_Man_t *, clause *)");
      }
      iVar3 = p->nWords;
      if (0 < iVar3) {
        iVar7 = 0;
        do {
          pVVar2 = p->vInfo;
          uVar4 = pVVar2->nSize;
          if (uVar4 == pVVar2->nCap) {
            if ((int)uVar4 < 0x10) {
              if (pVVar2->pArray == (word *)0x0) {
                pwVar5 = (word *)malloc(0x80);
              }
              else {
                pwVar5 = (word *)realloc(pVVar2->pArray,0x80);
              }
              pVVar2->pArray = pwVar5;
              if (pwVar5 == (word *)0x0) {
LAB_004f669c:
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                              ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
              }
              pVVar2->nCap = 0x10;
            }
            else {
              if (pVVar2->pArray == (word *)0x0) {
                pwVar5 = (word *)malloc((ulong)uVar4 << 4);
              }
              else {
                pwVar5 = (word *)realloc(pVVar2->pArray,(ulong)uVar4 << 4);
              }
              pVVar2->pArray = pwVar5;
              if (pwVar5 == (word *)0x0) goto LAB_004f669c;
              pVVar2->nCap = uVar4 * 2;
            }
          }
          else {
            pwVar5 = pVVar2->pArray;
          }
          iVar3 = pVVar2->nSize;
          pVVar2->nSize = iVar3 + 1;
          pwVar5[iVar3] = 0;
          iVar7 = iVar7 + 1;
          iVar3 = p->nWords;
        } while (iVar7 < iVar3);
      }
      if (p->pInfo != (word *)0x0) {
        __assert_fail("p->pInfo == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                      ,0x107,"void Prf_ManChainStart(Prf_Man_t *, clause *)");
      }
      iVar7 = p->vInfo->nSize;
      uVar4 = (iVar7 / iVar3 + -1) * iVar3;
      if (((int)uVar4 < 0) || (iVar7 <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                      ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      p->pInfo = p->vInfo->pArray + uVar4;
      Prf_ManChainResolve(p,c);
    }
    if (s->pPrf1 != (Vec_Set_t *)0x0) {
      cVar1 = *c;
      if (((uint)cVar1 & 1) == 0) {
        iVar3 = (int)c[(ulong)((uint)cVar1 >> 0xb) + 1] * 4 + 1;
      }
      else {
        iVar3 = (s->claProofs).ptr[(int)c[(ulong)((uint)cVar1 >> 0xb) + 1]] << 2;
      }
      if (iVar3 < 4) {
        __assert_fail("(ProofId >> 2) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                      ,0xb3,"void proof_chain_start(sat_solver2 *, clause *)");
      }
      if ((s->temp_proof).size < 0) {
        __assert_fail("k <= v->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satVec.h"
                      ,0x30,"void veci_resize(veci *, int)");
      }
      (s->temp_proof).size = 0;
      iVar7 = 0;
      if ((s->temp_proof).cap == 0) {
        piVar6 = (s->temp_proof).ptr;
        if (piVar6 == (int *)0x0) {
          piVar6 = (int *)malloc(0);
        }
        else {
          piVar6 = (int *)realloc(piVar6,0);
        }
        (s->temp_proof).ptr = piVar6;
        if (piVar6 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->temp_proof).cap * 9.5367431640625e-07,0);
          fflush(_stdout);
        }
        (s->temp_proof).cap = 0;
        iVar7 = (s->temp_proof).size;
      }
      piVar6 = (s->temp_proof).ptr;
      (s->temp_proof).size = iVar7 + 1;
      piVar6[iVar7] = 0;
      uVar4 = (s->temp_proof).size;
      if (uVar4 == (s->temp_proof).cap) {
        iVar7 = (uVar4 >> 1) * 3;
        if ((int)uVar4 < 4) {
          iVar7 = uVar4 * 2;
        }
        piVar6 = (int *)realloc(piVar6,(long)iVar7 << 2);
        (s->temp_proof).ptr = piVar6;
        if (piVar6 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->temp_proof).cap * 9.5367431640625e-07,
                 (double)iVar7 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->temp_proof).cap = iVar7;
        uVar4 = (s->temp_proof).size;
      }
      (s->temp_proof).size = uVar4 + 1;
      piVar6[(int)uVar4] = 0;
      uVar4 = (s->temp_proof).size;
      if (uVar4 == (s->temp_proof).cap) {
        iVar7 = (uVar4 >> 1) * 3;
        if ((int)uVar4 < 4) {
          iVar7 = uVar4 * 2;
        }
        piVar6 = (int *)realloc(piVar6,(long)iVar7 << 2);
        (s->temp_proof).ptr = piVar6;
        if (piVar6 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)(s->temp_proof).cap * 9.5367431640625e-07,
                 (double)iVar7 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->temp_proof).cap = iVar7;
        uVar4 = (s->temp_proof).size;
      }
      (s->temp_proof).size = uVar4 + 1;
      piVar6[(int)uVar4] = iVar3;
    }
  }
  return;
}

Assistant:

static inline void proof_chain_start( sat_solver2* s, clause* c )
{
    if ( !s->fProofLogging )
        return;
    if ( s->pInt2 )
        s->tempInter = Int2_ManChainStart( s->pInt2, c );
    if ( s->pPrf2 )
        Prf_ManChainStart( s->pPrf2, c );
    if ( s->pPrf1 )
    {
        int ProofId = clause2_proofid(s, c, 0);
        assert( (ProofId >> 2) > 0 );
        veci_resize( &s->temp_proof, 0 );
        veci_push( &s->temp_proof, 0 );
        veci_push( &s->temp_proof, 0 );
        veci_push( &s->temp_proof, ProofId );
    }
}